

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void __thiscall JsonArray_MisplacedComma_Test::TestBody(JsonArray_MisplacedComma_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_1f8;
  error_code local_1f0;
  AssertionResult gtest_ar;
  parser<json_out_callbacks> p;
  json_out_callbacks local_108;
  json_out_callbacks local_e8;
  json_out_callbacks local_c8;
  json_out_callbacks local_a8;
  result_type local_88;
  result_type local_68;
  result_type local_48;
  result_type local_28;
  
  local_a8.out_._M_dataplus._M_p = (pointer)&local_a8.out_.field_2;
  local_a8.out_.field_2._M_allocated_capacity = 0;
  local_a8.out_.field_2._8_8_ = 0;
  local_a8.out_._M_string_length = 0;
  pstore::json::parser<json_out_callbacks>::parser(&p,&local_a8,none);
  std::__cxx11::string::~string((string *)&local_a8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,"[,",2
              );
  pstore::json::parser<json_out_callbacks>::input(&p,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_28,&p);
  std::__cxx11::string::~string((string *)&local_28);
  local_1f0._M_cat = pstore::json::get_error_category();
  local_1f0._M_value = 8;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&p.error_,&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x97,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
    if ((long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser(&p);
  local_c8.out_._M_dataplus._M_p = (pointer)&local_c8.out_.field_2;
  local_c8.out_.field_2._M_allocated_capacity = 0;
  local_c8.out_.field_2._8_8_ = 0;
  local_c8.out_._M_string_length = 0;
  pstore::json::parser<json_out_callbacks>::parser(&p,&local_c8,none);
  std::__cxx11::string::~string((string *)&local_c8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,"[,1",
               3);
  pstore::json::parser<json_out_callbacks>::input(&p,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_48,&p);
  std::__cxx11::string::~string((string *)&local_48);
  local_1f0._M_cat = pstore::json::get_error_category();
  local_1f0._M_value = 8;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&p.error_,&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x9d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
    if ((long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser(&p);
  local_e8.out_._M_dataplus._M_p = (pointer)&local_e8.out_.field_2;
  local_e8.out_.field_2._M_allocated_capacity = 0;
  local_e8.out_.field_2._8_8_ = 0;
  local_e8.out_._M_string_length = 0;
  pstore::json::parser<json_out_callbacks>::parser(&p,&local_e8,none);
  std::__cxx11::string::~string((string *)&local_e8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
               "[1,,2]",6);
  pstore::json::parser<json_out_callbacks>::input(&p,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_68,&p);
  std::__cxx11::string::~string((string *)&local_68);
  local_1f0._M_cat = pstore::json::get_error_category();
  local_1f0._M_value = 8;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&p.error_,&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa3,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
    if ((long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser(&p);
  local_108.out_._M_dataplus._M_p = (pointer)&local_108.out_.field_2;
  local_108.out_.field_2._M_allocated_capacity = 0;
  local_108.out_.field_2._8_8_ = 0;
  local_108.out_._M_string_length = 0;
  pstore::json::parser<json_out_callbacks>::parser(&p,&local_108,none);
  std::__cxx11::string::~string((string *)&local_108);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
               "[1 true]",8);
  pstore::json::parser<json_out_callbacks>::input(&p,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_88,&p);
  std::__cxx11::string::~string((string *)&local_88);
  local_1f0._M_cat = pstore::json::get_error_category();
  local_1f0._M_value = 1;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::expected_array_member)",&p.error_,&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa9,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
    if ((long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonArray, MisplacedComma) {
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,1"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1,,2]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1 true]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
    }
}